

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Own<capnp::ClientHook> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,Array<capnp::PipelineOp> *ops)

{
  EventLoop *pEVar1;
  Event *pEVar2;
  Event **ppEVar3;
  uint *puVar4;
  PromiseNode *pPVar5;
  Refcounted *refcounted;
  TransformPromiseNodeBase *this_00;
  QueuedClient *this_01;
  undefined8 *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar6;
  Own<capnp::ClientHook> OVar7;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::Own<capnp::PipelineHook>_>
  clientPromise;
  Promise<kj::Own<capnp::ClientHook>_> local_68;
  undefined1 local_58 [8];
  PromiseNode *local_50;
  EventLoop *local_40;
  Event *pEStack_38;
  Event **local_30;
  
  if (ops[2].ptr == (PipelineOp *)0x0) {
    kj::_::ForkHub<kj::Own<capnp::PipelineHook>_>::addBranch
              ((ForkHub<kj::Own<capnp::PipelineHook>_> *)local_58);
    pEVar1 = (EventLoop *)*in_RDX;
    pEVar2 = (Event *)in_RDX[1];
    ppEVar3 = (Event **)in_RDX[2];
    *in_RDX = 0;
    in_RDX[1] = 0;
    local_40 = pEVar1;
    pEStack_38 = pEVar2;
    local_30 = ppEVar3;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)local_58,
               kj::
               CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::$_0,kj::Array<capnp::PipelineOp>>
               ::operator());
    pPVar5 = local_50;
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006420c8;
    this_00[1].dependency.disposer = (Disposer *)pEVar1;
    this_00[1].dependency.ptr = (PromiseNode *)pEVar2;
    this_00[1].continuationTracePtr = ppEVar3;
    local_40 = (EventLoop *)0x0;
    pEStack_38 = (Event *)0x0;
    local_68.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::PipelineHook>,kj::CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::$_0,kj::Array<capnp::PipelineOp>>,kj::_::PropagateException>>
          ::instance;
    local_68.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
    if (local_50 != (PromiseNode *)0x0) {
      local_50 = (PromiseNode *)0x0;
      (**(code **)*(_func_int **)local_58)
                (local_58,pPVar5->_vptr_PromiseNode[-2] + (long)&pPVar5->_vptr_PromiseNode);
    }
    this_01 = (QueuedClient *)operator_new(0x68);
    QueuedClient::QueuedClient(this_01,&local_68);
    pPVar5 = local_68.super_PromiseBase.node.ptr;
    puVar4 = &(this_01->super_Refcounted).refcount;
    *puVar4 = *puVar4 + 1;
    (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&this_01->super_Refcounted;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)this_01;
    pCVar6 = extraout_RDX_00;
    if ((TransformPromiseNodeBase *)local_68.super_PromiseBase.node.ptr !=
        (TransformPromiseNodeBase *)0x0) {
      local_68.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_68.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_68.super_PromiseBase.node.disposer,
                 ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar6 = extraout_RDX_01;
    }
  }
  else {
    (**(code **)((long)*ops[2].ptr + 0x10))(this);
    pCVar6 = extraout_RDX;
  }
  OVar7.ptr = pCVar6;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_MAYBE(r, redirect) {
    return r->get()->getPipelinedCap(kj::mv(ops));
  } else {
    auto clientPromise = promise.addBranch().then(kj::mvCapture(ops,
        [](kj::Array<PipelineOp>&& ops, kj::Own<PipelineHook> pipeline) {
          return pipeline->getPipelinedCap(kj::mv(ops));
        }));

    return kj::refcounted<QueuedClient>(kj::mv(clientPromise));
  }